

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

PHYSFS_File * PHYSFS_openRead(char *_fname)

{
  DirHandle *h;
  void *pvVar1;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  PHYSFS_uint64 PVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  PHYSFS_Io *pPVar10;
  FileHandle *pFVar11;
  char *pcVar12;
  undefined1 *puVar13;
  undefined8 *puVar14;
  size_t len;
  undefined1 *ptr;
  DirHandle **ppDVar15;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  char *local_40;
  char *arcfname;
  
  puVar13 = auStack_48;
  if (_fname == (char *)0x0) {
    uStack_50 = 0x10933b;
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else {
    uStack_50 = 0x1092f3;
    __PHYSFS_platformGrabMutex(stateLock);
    if (searchPath == (DirHandle *)0x0) {
      puVar14 = &uStack_50;
      uStack_50 = 0xb;
    }
    else {
      uStack_50 = 0x109305;
      sVar8 = strlen(_fname);
      len = longest_root + sVar8 + 2;
      if (len < 0x100) {
        puVar13 = auStack_48 + -(longest_root + sVar8 + 0x19 & 0xfffffffffffffff0);
        ptr = puVar13;
      }
      else {
        ptr = (undefined1 *)0x0;
      }
      *(undefined8 *)(puVar13 + -8) = 0x10934b;
      pcVar9 = (char *)__PHYSFS_initSmallAlloc(ptr,len);
      if (pcVar9 != (char *)0x0) {
        lVar6 = longest_root + 1;
        *(undefined8 *)(puVar13 + -8) = 0x10936c;
        iVar7 = sanitizePlatformIndependentPath(_fname,pcVar9 + lVar6);
        if (iVar7 == 0) {
          pFVar11 = (FileHandle *)0x0;
          pcVar12 = pcVar9;
        }
        else {
          pFVar11 = (FileHandle *)0x0;
          ppDVar15 = &searchPath;
          arcfname = pcVar9;
          while (h = *ppDVar15, pcVar12 = arcfname, h != (DirHandle *)0x0) {
            local_40 = pcVar9 + lVar6;
            *(undefined8 *)(puVar13 + -8) = 0x10939f;
            iVar7 = verifyPath(h,&local_40,0);
            pcVar12 = local_40;
            if (iVar7 != 0) {
              pvVar1 = h->opaque;
              p_Var2 = h->funcs->openRead;
              *(undefined8 *)(puVar13 + -8) = 0x1093b1;
              pPVar10 = (*p_Var2)(pvVar1,pcVar12);
              if (pPVar10 != (PHYSFS_Io *)0x0) {
                *(undefined8 *)(puVar13 + -8) = 0x40;
                PVar4 = *(PHYSFS_uint64 *)(puVar13 + -8);
                *(undefined8 *)(puVar13 + -8) = 0x1093f6;
                pFVar11 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(PVar4);
                if (pFVar11 == (FileHandle *)0x0) {
                  p_Var3 = pPVar10->destroy;
                  *(undefined8 *)(puVar13 + -8) = 0x109432;
                  (*p_Var3)(pPVar10);
                  *(undefined8 *)(puVar13 + -8) = 2;
                  uVar5 = *(undefined8 *)(puVar13 + -8);
                  *(undefined8 *)(puVar13 + -8) = 0x10943a;
                  PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar5);
                  pFVar11 = (FileHandle *)0x0;
                  pcVar12 = arcfname;
                }
                else {
                  *(undefined8 *)&pFVar11->forReading = 0;
                  pFVar11->dirHandle = (DirHandle *)0x0;
                  pFVar11->buffill = 0;
                  pFVar11->bufpos = 0;
                  pFVar11->buffer = (PHYSFS_uint8 *)0x0;
                  pFVar11->bufsize = 0;
                  pFVar11->io = pPVar10;
                  pFVar11->forReading = '\x01';
                  pFVar11->dirHandle = h;
                  pFVar11->next = openReadList;
                  pcVar12 = arcfname;
                  openReadList = pFVar11;
                }
                break;
              }
            }
            ppDVar15 = &h->next;
          }
        }
        *(undefined8 *)(puVar13 + -8) = 0x10944d;
        __PHYSFS_platformReleaseMutex(stateLock);
        if (*(long *)(pcVar12 + -8) == 0) {
          return (PHYSFS_File *)pFVar11;
        }
        *(undefined8 *)(puVar13 + -8) = 0x109465;
        (*__PHYSFS_AllocatorHooks.Free)(pcVar12 + -8);
        return (PHYSFS_File *)pFVar11;
      }
      puVar14 = (undefined8 *)(puVar13 + -8);
      *(undefined8 *)(puVar13 + -8) = 2;
    }
    uVar5 = *puVar14;
    *puVar14 = 0x1093c4;
    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar5);
    *puVar14 = 0x1093d0;
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return (PHYSFS_File *)0x0;
}

Assistant:

PHYSFS_File *PHYSFS_openRead(const char *_fname)
{
    FileHandle *fh = NULL;
    char *allocated_fname;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    BAIL_IF_MUTEX(!searchPath, PHYSFS_ERR_NOT_FOUND, stateLock, 0);

    len = strlen(_fname) + longest_root + 2;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root + 1;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        PHYSFS_Io *io = NULL;
        DirHandle *i;

        for (i = searchPath; i != NULL; i = i->next)
        {
            char *arcfname = fname;
            if (verifyPath(i, &arcfname, 0))
            {
                io = i->funcs->openRead(i->opaque, arcfname);
                if (io)
                    break;
            } /* if */
        } /* for */

        if (io)
        {
            fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
            if (fh == NULL)
            {
                io->destroy(io);
                PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            } /* if */
            else
            {
                memset(fh, '\0', sizeof (FileHandle));
                fh->io = io;
                fh->forReading = 1;
                fh->dirHandle = i;
                fh->next = openReadList;
                openReadList = fh;
            } /* else */
        } /* if */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);
    return ((PHYSFS_File *) fh);
}